

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

void __thiscall
wabt::intrusive_list<wabt::ModuleField>::push_back
          (intrusive_list<wabt::ModuleField> *this,
          unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *node)

{
  pointer pMVar1;
  bool bVar2;
  ModuleField *node_p;
  unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_> *node_local;
  intrusive_list<wabt::ModuleField> *this_local;
  
  pMVar1 = std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::operator->
                     (node);
  bVar2 = false;
  if ((pMVar1->super_intrusive_list_base<wabt::ModuleField>).prev_ == (ModuleField *)0x0) {
    pMVar1 = std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::operator->
                       (node);
    bVar2 = (pMVar1->super_intrusive_list_base<wabt::ModuleField>).next_ == (ModuleField *)0x0;
  }
  if (!bVar2) {
    __assert_fail("node->prev_ == nullptr && node->next_ == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                  ,0x1bd,
                  "void wabt::intrusive_list<wabt::ModuleField>::push_back(std::unique_ptr<T>) [T = wabt::ModuleField]"
                 );
  }
  pMVar1 = std::unique_ptr<wabt::ModuleField,_std::default_delete<wabt::ModuleField>_>::release
                     (node);
  if (this->last_ == (ModuleField *)0x0) {
    this->first_ = pMVar1;
  }
  else {
    (pMVar1->super_intrusive_list_base<wabt::ModuleField>).prev_ = this->last_;
    (this->last_->super_intrusive_list_base<wabt::ModuleField>).next_ = pMVar1;
  }
  this->last_ = pMVar1;
  this->size_ = this->size_ + 1;
  return;
}

Assistant:

inline void intrusive_list<T>::push_back(std::unique_ptr<T> node) {
  assert(node->prev_ == nullptr && node->next_ == nullptr);

  T* node_p = node.release();
  if (last_) {
    node_p->prev_ = last_;
    last_->next_ = node_p;
  } else {
    first_ = node_p;
  }
  last_ = node_p;
  size_++;
}